

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

void __thiscall MobileElementManager::Insert(MobileElementManager *this,Ptr *pol,Ptr *polymer)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  difference_type __n;
  SpeciesTracker *this_00;
  element_type *peVar5;
  string *psVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *pmVar7;
  pointer ppVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_01;
  pointer ppVar9;
  reference pvVar10;
  size_type sVar11;
  size_type sVar12;
  runtime_error *this_02;
  double dVar13;
  double local_148;
  const_iterator local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *anticodon;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  const_iterator anticodons;
  string codon;
  SpeciesTracker *tracker;
  double weight;
  pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> local_b0;
  const_iterator local_90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_88;
  __normal_iterator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_*,_std::vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>_>
  local_80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> prop_it;
  __normal_iterator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_*,_std::vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>_>
  local_48;
  __normal_iterator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_*,_std::vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>_>
  it;
  pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> pol_polymer;
  Ptr *polymer_local;
  Ptr *pol_local;
  MobileElementManager *this_local;
  
  std::make_pair<std::shared_ptr<MobileElement>&,std::shared_ptr<Polymer>&>
            ((pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)&it,pol,polymer);
  iVar3 = std::
          vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
          ::begin(&this->polymerases_);
  iVar4 = std::
          vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
          ::end(&this->polymerases_);
  local_48 = std::
             upper_bound<__gnu_cxx::__normal_iterator<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>*,std::vector<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>,std::allocator<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>>>>,std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>,MobileElementManager::Insert(std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>)::__0>
                       (iVar3._M_current,iVar4._M_current,
                        (pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)&it);
  local_80._M_current =
       (pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)
       std::
       vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
       ::begin(&this->polymerases_);
  __n = __gnu_cxx::operator-(&local_48,&local_80);
  local_88._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(&this->prop_list_);
  local_78 = __gnu_cxx::operator+(__n,&local_88);
  __gnu_cxx::
  __normal_iterator<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>const*,std::vector<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>,std::allocator<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>>>>
  ::__normal_iterator<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>*>
            ((__normal_iterator<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>const*,std::vector<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>,std::allocator<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>>>>
              *)&local_90,&local_48);
  std::make_pair<std::shared_ptr<MobileElement>&,std::shared_ptr<Polymer>&>(&local_b0,pol,polymer);
  std::
  vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ::insert(&this->polymerases_,local_90,&local_b0);
  std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::~pair(&local_b0);
  tracker = (SpeciesTracker *)0x3ff0000000000000;
  this_00 = SpeciesTracker::Instance();
  peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)pol);
  psVar6 = MobileElement::name_abi_cxx11_(peVar5);
  bVar1 = std::operator==(psVar6,"__ribosome");
  if (bVar1) {
    pmVar7 = SpeciesTracker::codon_map_abi_cxx11_(this_00);
    bVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::empty(pmVar7);
    if (!bVar1) {
      tracker = (SpeciesTracker *)0x0;
      peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)pol);
      MobileElement::stop(peVar5);
      std::__cxx11::string::substr((ulong)&anticodons,(ulong)&this->seq_);
      pmVar7 = SpeciesTracker::codon_map_abi_cxx11_(this_00);
      __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::find(pmVar7,(key_type *)&anticodons);
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&__range2);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&ppVar8->second);
      anticodon = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(&ppVar8->second);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&anticodon), bVar1) {
        local_110 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
        this_01 = SpeciesTracker::species_abi_cxx11_(this_00);
        std::operator+(&local_138,local_110,"_charged");
        local_118._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(this_01,&local_138);
        ppVar9 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                 ::operator->(&local_118);
        tracker = (SpeciesTracker *)((double)ppVar9->second + (double)tracker);
        std::__cxx11::string::~string((string *)&local_138);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::__cxx11::string::~string((string *)&anticodons);
      goto LAB_0011b4e6;
    }
  }
  peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)pol);
  psVar6 = MobileElement::name_abi_cxx11_(peVar5);
  bVar1 = std::operator==(psVar6,"__ribosome");
  if ((bVar1) &&
     (bVar1 = std::vector<double,_std::allocator<double>_>::empty(&this->weights_), !bVar1)) {
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    iVar2 = MobileElement::stop(peVar5);
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        (&this->weights_,(long)(iVar2 + -1));
    tracker = (SpeciesTracker *)(*pvVar10 + 0.0);
  }
LAB_0011b4e6:
  peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)pol);
  dVar13 = MobileElement::speed(peVar5);
  this->prop_sum_ = (double)tracker * dVar13 + this->prop_sum_;
  __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
  __normal_iterator<double*>
            ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
             &local_140,&local_78);
  peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)pol);
  local_148 = MobileElement::speed(peVar5);
  local_148 = (double)tracker * local_148;
  std::vector<double,_std::allocator<double>_>::insert(&this->prop_list_,local_140,&local_148);
  sVar11 = std::vector<double,_std::allocator<double>_>::size(&this->prop_list_);
  sVar12 = std::
           vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
           ::size(&this->polymerases_);
  if (sVar11 == sVar12) {
    peVar5 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pol);
    psVar6 = MobileElement::name_abi_cxx11_(peVar5);
    bVar1 = std::operator!=(psVar6,"__rnase");
    if (bVar1) {
      this->pol_count_ = this->pol_count_ + 1;
    }
    std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::~pair
              ((pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)&it);
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,"Prop list not correct size.");
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MobileElementManager::Insert(MobileElement::Ptr pol,
                                  Polymer::Ptr polymer) {
  // Find where in vector polymerase should insert; use a lambda function
  // to make comparison between polymerase pointers
  auto pol_polymer = std::make_pair(pol, polymer);
  auto it =
      std::upper_bound(polymerases_.begin(), polymerases_.end(), pol_polymer,
                       [](std::pair<MobileElement::Ptr, Polymer::Ptr> a,
                          std::pair<MobileElement::Ptr, Polymer::Ptr> b) {
                         return a.first->start() < b.first->start();
                       });
  // Record position for prop_list_
  // NOTE: iterators become invalid as soon as a vector is changed!!
  // Attempting to use an iterator twice will lead to a segfault.
  auto prop_it = (it - polymerases_.begin()) + prop_list_.begin();
  // Add polymerase to this polymer
  polymerases_.insert(it, std::make_pair(pol, polymer));
  
  //Set propensity
  double weight = 1;
  auto &tracker = SpeciesTracker::Instance();
  if (pol->name() == "__ribosome" && !tracker.codon_map().empty()) { 
    weight--;
    /**
     * Steps:
     * 1. get pol position, codon from indexing sequence
     * 2. get anticodon(s) from codon-anticodon map
     * 3. get the total number of available tRNAs
     */
    std::string codon = seq_.substr(pol->stop(), 3);
    //std::cout << codon << std::endl;
    //std::cout << pol->stop() << std::endl;
    auto anticodons = tracker.codon_map().find(codon);
    for (auto const& anticodon : anticodons->second) {
      //std::cout << anticodon << std::endl;
      weight += tracker.species().find(anticodon + "_charged")->second;
    } 
  } else if (pol->name() == "__ribosome" && !weights_.empty()) {
      weight--;
      // weight propensity by index
      weight += weights_[pol->stop() - 1];
  }
  // Update total move propensity of this polymer
  prop_sum_ += weight * pol->speed();
  prop_list_.insert(prop_it, weight * pol->speed());

  if (prop_list_.size() != polymerases_.size()) {
    throw std::runtime_error("Prop list not correct size.");
  }
  // Keep running count of non-RNAse mobile elements
  if (pol->name() != "__rnase") {
    pol_count_ += 1;
  }
}